

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O1

mac_address ixgbe_get_mac_addr(ixy_device *ixy)

{
  uint uVar1;
  ixgbe_device *dev;
  
  uVar1 = *(uint *)(ixy[1].pci_addr + 0x5400);
  return (uint8_t  [6])
         ((uint6)(uVar1 & 0xff) |
         (uint6)(uVar1 & 0xff00) |
         (uint6)(uVar1 & 0xff0000) |
         (uint6)(uVar1 & 0xff000000) |
         (uint6)(*(uint *)(ixy[1].pci_addr + 0x5404) & 0xff) << 0x20 |
         (uint6)(*(uint *)(ixy[1].pci_addr + 0x5404) >> 8) << 0x28);
}

Assistant:

struct mac_address ixgbe_get_mac_addr(const struct ixy_device* ixy) {
	struct mac_address mac;
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);

	uint32_t rar_low = get_reg32(dev->addr, IXGBE_RAL(0));
	uint32_t rar_high = get_reg32(dev->addr, IXGBE_RAH(0));

	mac.addr[0] = rar_low;
	mac.addr[1] = rar_low >> 8;
	mac.addr[2] = rar_low >> 16;
	mac.addr[3] = rar_low >> 24;
	mac.addr[4] = rar_high;
	mac.addr[5] = rar_high >> 8;

	return mac;
}